

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

void pybind11::detail::keep_alive_impl(handle nurse,handle patient)

{
  vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_> *__x;
  undefined1 local_48 [8];
  vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_> tinfo;
  weakref wr;
  cpp_function disable_lifesupport;
  
  if ((nurse.m_ptr != (PyObject *)0x0) && (patient.m_ptr != (PyObject *)0x0)) {
    if (nurse.m_ptr != (PyObject *)&_Py_NoneStruct && patient.m_ptr != (PyObject *)&_Py_NoneStruct)
    {
      __x = all_type_info((nurse.m_ptr)->ob_type);
      std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>::
      vector((vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
              *)local_48,__x);
      if (local_48 ==
          (undefined1  [8])
          tinfo.
          super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        tinfo.
        super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)patient.m_ptr;
        cpp_function::
        cpp_function<pybind11::detail::keep_alive_impl(pybind11::handle,pybind11::handle)::_lambda(pybind11::handle)_1_,,void>
                  ((cpp_function *)&wr,
                   (type *)&tinfo.
                            super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        weakref::weakref((weakref *)
                         &tinfo.
                          super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,nurse,
                         (handle)wr.super_object.super_handle.m_ptr);
        (patient.m_ptr)->ob_refcnt = (patient.m_ptr)->ob_refcnt + 1;
        tinfo.
        super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        object::~object((object *)
                        &tinfo.
                         super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
        object::~object(&wr.super_object);
      }
      else {
        add_patient(nurse.m_ptr,patient.m_ptr);
      }
      std::
      _Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>::
      ~_Vector_base((_Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                     *)local_48);
    }
    return;
  }
  pybind11_fail("Could not activate keep_alive!");
}

Assistant:

void keep_alive_impl(handle nurse, handle patient) {
    if (!nurse || !patient)
        pybind11_fail("Could not activate keep_alive!");

    if (patient.is_none() || nurse.is_none())
        return; /* Nothing to keep alive or nothing to be kept alive by */

    auto tinfo = all_type_info(Py_TYPE(nurse.ptr()));
    if (!tinfo.empty()) {
        /* It's a pybind-registered type, so we can store the patient in the
         * internal list. */
        add_patient(nurse.ptr(), patient.ptr());
    }
    else {
        /* Fall back to clever approach based on weak references taken from
         * Boost.Python. This is not used for pybind-registered types because
         * the objects can be destroyed out-of-order in a GC pass. */
        cpp_function disable_lifesupport(
            [patient](handle weakref) { patient.dec_ref(); weakref.dec_ref(); });

        weakref wr(nurse, disable_lifesupport);

        patient.inc_ref(); /* reference patient and leak the weak reference */
        (void) wr.release();
    }
}